

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O3

void __thiscall CompilerStatistics::Add(CompilerStatistics *this,CompilerStatistics *other)

{
  int *piVar1;
  uint uVar2;
  Timer *pTVar3;
  Timer *pTVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = (ulong)(this->timers).count;
  if (uVar5 != 0) {
    uVar2 = (other->timers).count;
    pTVar3 = (other->timers).data;
    pTVar4 = (this->timers).data;
    lVar6 = 0;
    do {
      if ((ulong)uVar2 * 0x28 == lVar6) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<CompilerStatistics::Timer, 16>::operator[](unsigned int) [T = CompilerStatistics::Timer, N = 16]"
                     );
      }
      piVar1 = (int *)((long)&pTVar4->total + lVar6);
      *piVar1 = *piVar1 + *(int *)((long)&pTVar3->total + lVar6);
      lVar6 = lVar6 + 0x28;
    } while (uVar5 * 0x28 != lVar6);
  }
  this->finishTime = 0;
  return;
}

Assistant:

void Add(CompilerStatistics& other)
	{
		for(unsigned i = 0; i < timers.size(); i++)
			timers[i].total += other.timers[i].total;

		finishTime = 0;
	}